

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstats.cpp
# Opt level: O1

void kernel::ApplyHash<MuHash3072>
               (MuHash3072 *hash_obj,Txid *hash,
               map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
               *outputs)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  long in_FS_OFFSET;
  Coin coin;
  COutPoint outpoint;
  Coin local_98;
  COutPoint local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = (outputs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(outputs->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      local_68.n = p_Var1[1]._M_color;
      local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(hash->m_wrapped).super_base_blob<256U>.m_data._M_elems;
      local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((hash->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
      local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((hash->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
      local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((hash->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
      local_98.out.nValue = (CAmount)p_Var1[1]._M_parent;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                (&local_98.out.scriptPubKey.super_CScriptBase,
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&p_Var1[1]._M_left);
      local_98._40_4_ = *(undefined4 *)&p_Var1[2]._M_left;
      ApplyCoinHash(hash_obj,&local_68,&local_98);
      if (0x1c < local_98.out.scriptPubKey.super_CScriptBase._size) {
        free(local_98.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
        local_98.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void ApplyHash(T& hash_obj, const Txid& hash, const std::map<uint32_t, Coin>& outputs)
{
    for (auto it = outputs.begin(); it != outputs.end(); ++it) {
        COutPoint outpoint = COutPoint(hash, it->first);
        Coin coin = it->second;
        ApplyCoinHash(hash_obj, outpoint, coin);
    }
}